

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O3

void DiscardPriorPreloaded(CP_Services Svcs,Evpath_RS_Stream RS_Stream,size_t Timestep)

{
  _RSTimestepEntry *p_Var1;
  char *block;
  CP_VerboseFunc p_Var2;
  void *pvVar3;
  size_t sVar4;
  CManager p_Var5;
  uint64_t uVar6;
  _RSTimestepEntry **pp_Var7;
  _RSTimestepEntry *p_Var8;
  _RSTimestepEntry *__ptr;
  RSTimestepList ItemToFree;
  
  if (RS_Stream->QueuedTimesteps != (_RSTimestepEntry *)0x0) {
    p_Var8 = (_RSTimestepEntry *)0x0;
    __ptr = RS_Stream->QueuedTimesteps;
    do {
      p_Var1 = __ptr->Next;
      if (__ptr->Timestep < Timestep) {
        p_Var5 = (*Svcs->getCManager)(RS_Stream->CP_Stream);
        pp_Var7 = &p_Var8->Next;
        if (p_Var8 == (_RSTimestepEntry *)0x0) {
          pp_Var7 = &RS_Stream->QueuedTimesteps;
        }
        *pp_Var7 = __ptr->Next;
        block = __ptr->Data;
        if (block != (char *)0x0) {
          p_Var2 = Svcs->verbose;
          pvVar3 = RS_Stream->CP_Stream;
          sVar4 = __ptr->Timestep;
          uVar6 = writeBlockFingerprint(block,__ptr->DataSize);
          (*p_Var2)(pvVar3,4,"Discarding prior, TS %ld, data %p, fprint %lx\n",sVar4,block,uVar6);
          CMreturn_buffer(p_Var5,__ptr->Data);
        }
        free(__ptr);
        __ptr = p_Var8;
      }
      p_Var8 = __ptr;
      __ptr = p_Var1;
    } while (p_Var1 != (_RSTimestepEntry *)0x0);
  }
  return;
}

Assistant:

static void DiscardPriorPreloaded(CP_Services Svcs, Evpath_RS_Stream RS_Stream, size_t Timestep)
{
    RSTimestepList Entry, Last = NULL;
    Entry = RS_Stream->QueuedTimesteps;

    while (Entry)
    {
        RSTimestepList Next = Entry->Next;
        if (Entry->Timestep < Timestep)
        {
            RSTimestepList ItemToFree = Entry;
            CManager cm = Svcs->getCManager(RS_Stream->CP_Stream);
            if (Last)
            {
                Last->Next = Entry->Next;
            }
            else
            {
                RS_Stream->QueuedTimesteps = Entry->Next;
            }
            /* free item */
            if (ItemToFree->Data)
            {
                Svcs->verbose(RS_Stream->CP_Stream, DPPerRankVerbose,
                              "Discarding prior, TS %ld, data %p, fprint %lx\n",
                              ItemToFree->Timestep, ItemToFree->Data,
                              writeBlockFingerprint(ItemToFree->Data, ItemToFree->DataSize));
                CMreturn_buffer(cm, ItemToFree->Data);
            }

            free(ItemToFree);
        }
        else
        {
            Last = Entry;
        }
        Entry = Next;
    }
}